

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priolist.c
# Opt level: O0

void nn_priolist_activate(nn_priolist *self,nn_priolist_data *data)

{
  int iVar1;
  nn_list *self_00;
  nn_list_item *in_RSI;
  long in_RDI;
  nn_priolist_slot *slot;
  nn_list_item *in_stack_ffffffffffffffd0;
  nn_list_item *it;
  nn_list_item *in_stack_ffffffffffffffd8;
  nn_list *in_stack_ffffffffffffffe0;
  nn_list *self_01;
  
  self_00 = (nn_list *)(in_RDI + (long)(*(int *)&in_RSI->prev + -1) * 0x18);
  iVar1 = nn_list_empty(self_00);
  if (iVar1 == 0) {
    self_01 = (nn_list *)(in_RSI + 1);
    nn_list_end(self_00);
    nn_list_insert(self_01,(nn_list_item *)self_00,in_stack_ffffffffffffffd0);
  }
  else {
    it = in_RSI + 1;
    nn_list_end(self_00);
    nn_list_insert(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,it);
    self_00[1].first = in_RSI;
    if (*(int *)(in_RDI + 0x180) == -1) {
      *(undefined4 *)(in_RDI + 0x180) = *(undefined4 *)&in_RSI->prev;
    }
    else if (*(int *)&in_RSI->prev < *(int *)(in_RDI + 0x180)) {
      *(undefined4 *)(in_RDI + 0x180) = *(undefined4 *)&in_RSI->prev;
    }
  }
  return;
}

Assistant:

void nn_priolist_activate (struct nn_priolist *self,
    struct nn_priolist_data *data)
{
    struct nn_priolist_slot *slot;

    slot = &self->slots [data->priority - 1];

    /*  If there are already some elements in this slot, current pipe is not
        going to change. */
    if (!nn_list_empty (&slot->pipes)) {
        nn_list_insert (&slot->pipes, &data->item, nn_list_end (&slot->pipes));
        return;
    }

    /*  Add first pipe into the slot. If there are no pipes in priolist at all
        this slot becomes current. */
    nn_list_insert (&slot->pipes, &data->item, nn_list_end (&slot->pipes));
    slot->current = data;
    if (self->current == -1) {
        self->current = data->priority;
        return;
    }

    /*  If the current priority is lower than the one of the newly activated
        pipe, this slot becomes current. */
    if (self->current > data->priority) {
        self->current = data->priority;
        return;
    }

    /*  Current doesn't change otherwise. */
}